

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGhsMultiGenerator::Generate(cmGlobalGhsMultiGenerator *this)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *this_00;
  reference ppVar2;
  reference ppcVar3;
  cmake *pcVar4;
  string *psVar5;
  undefined1 local_530 [8];
  cmGeneratedFileStream ftarget;
  undefined1 local_2c8 [8];
  cmGeneratedFileStream frule;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *__range1;
  undefined1 local_30 [8];
  string fname;
  cmGlobalGhsMultiGenerator *this_local;
  
  fname.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  cmGlobalGenerator::Generate(&this->super_cmGlobalGenerator);
  this_00 = &(this->super_cmGlobalGenerator).ProjectMap;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
           ::begin(this_00);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator*(&__end1);
    ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar2->second,0);
    OutputTopLevelProject(this,*ppcVar3,&ppVar2->second);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
    ::operator++(&__end1);
  }
  pcVar4 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
  psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &frule.field_0x240,psVar5,"/CMakeFiles/custom_rule.bod");
  std::__cxx11::string::operator=((string *)local_30,(string *)&frule.field_0x240);
  std::__cxx11::string::~string((string *)&frule.field_0x240);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2c8,(string *)local_30,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2c8,true);
  WriteFileHeader(this,(ostream *)local_2c8);
  WriteCustomRuleBOD(this,(ostream *)local_2c8);
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_2c8);
  pcVar4 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
  psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ftarget.field_0x240,psVar5,"/CMakeFiles/custom_target.bod");
  std::__cxx11::string::operator=((string *)local_30,(string *)&ftarget.field_0x240);
  std::__cxx11::string::~string((string *)&ftarget.field_0x240);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_530,(string *)local_30,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_530,true);
  WriteFileHeader(this,(ostream *)local_530);
  WriteCustomTargetBOD(this,(ostream *)local_530);
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_530);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_530);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2c8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::Generate()
{
  std::string fname;

  // first do the superclass method
  this->cmGlobalGenerator::Generate();

  // output top-level projects
  for (auto& it : this->ProjectMap) {
    this->OutputTopLevelProject(it.second[0], it.second);
  }

  // create custom rule BOD file
  fname = this->GetCMakeInstance()->GetHomeOutputDirectory() +
    "/CMakeFiles/custom_rule.bod";
  cmGeneratedFileStream frule(fname);
  frule.SetCopyIfDifferent(true);
  this->WriteFileHeader(frule);
  this->WriteCustomRuleBOD(frule);
  frule.Close();

  // create custom target BOD file
  fname = this->GetCMakeInstance()->GetHomeOutputDirectory() +
    "/CMakeFiles/custom_target.bod";
  cmGeneratedFileStream ftarget(fname);
  ftarget.SetCopyIfDifferent(true);
  this->WriteFileHeader(ftarget);
  this->WriteCustomTargetBOD(ftarget);
  ftarget.Close();
}